

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wxcli.hpp
# Opt level: O2

void __thiscall ws::Cli::get_access_token(Cli *this)

{
  reference pvVar1;
  Error error;
  long lVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator<char> local_579;
  string local_578;
  undefined1 local_558 [32];
  source_location local_538;
  size_t local_530;
  Result res;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e8;
  Params params;
  _Any_data local_478;
  undefined8 local_468;
  undefined8 uStack_460;
  _Any_data local_458;
  undefined8 local_448;
  undefined8 uStack_440;
  SSLClient cli;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"qyapi.weixin.qq.com",(allocator<char> *)&params);
  httplib::SSLClient::SSLClient(&cli,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&res,(char (*) [7])"corpid",&this->corp_id);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_4e8,(char (*) [11])"corpsecret",&this->corp_secret);
  __l._M_len = 2;
  __l._M_array = (iterator)&res;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&params,__l,
             (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_558,(allocator_type *)&local_578);
  lVar2 = 0x40;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&res.res_._M_t.
                       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
               + lVar2));
    lVar2 = lVar2 + -0x40;
  } while (lVar2 != -0x40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,"/cgi-bin/gettoken",&local_579);
  local_558._24_8_ = local_558 + 8;
  local_558._0_8_ = (pointer)0x0;
  local_558._8_8_ = 0;
  local_558._16_8_ = (_Base_ptr)0x0;
  local_530 = 0;
  local_458._M_unused._M_object = (void *)0x0;
  local_458._8_8_ = 0;
  local_448 = 0;
  uStack_440 = 0;
  local_538._M_impl = (__impl *)local_558._24_8_;
  httplib::ClientImpl::Get
            (&res,&cli.super_ClientImpl,&local_578,&params,(Headers *)local_558,
             (Progress *)&local_458);
  std::_Function_base::~_Function_base((_Function_base *)&local_458);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_558);
  std::__cxx11::string::~string((string *)&local_578);
  if (((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)
       res.res_._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0) ||
     (*(int *)((long)res.res_._M_t.
                     super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                     .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20) != 200)
     ) {
    std::__cxx11::string::string
              ((string *)local_558,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               no_fmt_abi_cxx11_);
    local_538._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195880;
    httplib::to_string_abi_cxx11_(&local_578,(httplib *)(ulong)res.err_,error);
    critical<char_const(&)[25],char_const(&)[8],std::__cxx11::string>
              ((FormatWithLoc *)local_558,(char (*) [25])"Get access token failed.",
               (char (*) [8])"Error: ",&local_578);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)local_558);
  }
  else {
    local_478._M_unused._M_object = (void *)0x0;
    local_478._8_8_ = 0;
    local_468 = 0;
    uStack_460 = 0;
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
    ::parse<std::__cxx11::string&>
              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)&local_578,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)res.res_._M_t.
                      super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                      .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78),
               (parser_callback_t *)&local_478,true,false);
    pvVar1 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_578,"access_token");
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_558,pvVar1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->access_token,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558);
    std::__cxx11::string::~string((string *)local_558);
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&local_578);
    std::_Function_base::~_Function_base((_Function_base *)&local_478);
  }
  httplib::Result::~Result(&res);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  httplib::SSLClient::~SSLClient(&cli);
  return;
}

Assistant:

void get_access_token()
    // see https://open.work.weixin.qq.com/api/doc/90000/90135/91039
    {
      httplib::SSLClient cli("qyapi.weixin.qq.com");
      httplib::Params params
          {
              {"corpid",     corp_id},
              {"corpsecret", corp_secret}
          };
      auto res = cli.Get("/cgi-bin/gettoken", params, httplib::Headers{}, httplib::Progress{});
      if (res == nullptr || res->status != 200)
      {
        critical(no_fmt, "Get access token failed.", "Error: ", httplib::to_string(res.error()));
      }
      else
      {
        access_token = nlohmann::json::parse(res->body)["access_token"].get<std::string>();
      }
    }